

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O1

bool __thiscall
iDynTree::BerdyHelper::serializeDynamicVariablesFixedBase
          (BerdyHelper *this,LinkProperAccArray *properAccs,
          LinkNetTotalWrenchesWithoutGravity *netTotalWrenchesWithoutGrav,
          LinkNetExternalWrenches *netExtWrenches,LinkInternalWrenches *linkJointWrenches,
          JointDOFsDoubleArray *jointTorques,JointDOFsDoubleArray *jointAccs,VectorDynSize *d)

{
  undefined8 uVar1;
  PointerType ptr;
  long lVar2;
  long lVar3;
  undefined8 *puVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long *plVar8;
  ulong uVar9;
  ulong uVar10;
  void *pvVar11;
  long lVar12;
  IndexRange IVar13;
  Matrix<double,_6,_1,_0,_6,_1> ret;
  undefined8 local_88 [4];
  undefined8 uStack_68;
  undefined8 local_60;
  LinkNetTotalWrenchesWithoutGravity *local_58;
  LinkNetExternalWrenches *local_50;
  LinkProperAccArray *local_48;
  LinkInternalWrenches *local_40;
  JointDOFsDoubleArray *local_38;
  
  if ((this->m_options).berdyVariant == ORIGINAL_BERDY_FIXED_BASE) {
    local_58 = netTotalWrenchesWithoutGrav;
    local_50 = netExtWrenches;
    local_48 = properAccs;
    local_40 = linkJointWrenches;
    local_38 = jointTorques;
    lVar2 = iDynTree::Model::getNrOfLinks();
    if (0 < lVar2) {
      lVar2 = 0;
      do {
        iDynTree::Traversal::getBaseLink();
        lVar3 = iDynTree::Link::getIndex();
        if (lVar2 != lVar3) {
          IVar13 = getRangeLinkVariable(this,LINK_BODY_PROPER_ACCELERATION,lVar2);
          uVar9 = IVar13.size;
          lVar3 = IVar13.offset;
          puVar4 = (undefined8 *)iDynTree::LinkAccArray::operator()(local_48,lVar2);
          local_88[0] = *puVar4;
          local_88[1] = puVar4[1];
          local_88[2] = puVar4[2];
          local_88[3] = puVar4[3];
          uStack_68 = puVar4[4];
          local_60 = puVar4[5];
          lVar5 = iDynTree::VectorDynSize::data();
          iDynTree::VectorDynSize::size();
          pvVar11 = (void *)(lVar3 * 8 + lVar5);
          if ((((ulong)pvVar11 & 7) != 0) ||
             (uVar10 = (ulong)((uint)((ulong)pvVar11 >> 3) & 1), (long)uVar9 <= (long)uVar10)) {
            uVar10 = uVar9;
          }
          if (0 < (long)uVar10) {
            memcpy(pvVar11,local_88,uVar10 * 8);
          }
          lVar6 = uVar9 - uVar10;
          lVar12 = (lVar6 - (lVar6 >> 0x3f) & 0xfffffffffffffffeU) + uVar10;
          if (1 < lVar6) {
            lVar7 = uVar10 + 2;
            if ((long)(uVar10 + 2) < lVar12) {
              lVar7 = lVar12;
            }
            memcpy((void *)((lVar3 + uVar10) * 8 + lVar5),local_88 + uVar10,
                   (~uVar10 + lVar7 & 0xfffffffffffffffe) * 8 + 0x10);
          }
          if (lVar12 < (long)uVar9) {
            memcpy((void *)(lVar3 * 8 + lVar5 + (lVar6 / 2) * 0x10 + uVar10 * 8),
                   local_88 + (lVar6 / 2) * 2 + uVar10,(uVar9 - lVar12) * 8);
          }
          IVar13 = getRangeLinkVariable(this,NET_INT_AND_EXT_WRENCHES_ON_LINK_WITHOUT_GRAV,lVar2);
          uVar9 = IVar13.size;
          lVar3 = IVar13.offset;
          lVar5 = iDynTree::LinkWrenches::operator()(local_58,lVar2);
          local_88[0] = *(undefined8 *)(lVar5 + 8);
          local_88[1] = *(undefined8 *)(lVar5 + 0x10);
          local_88[2] = *(undefined8 *)(lVar5 + 0x18);
          local_88[3] = *(undefined8 *)(lVar5 + 0x20);
          uStack_68 = *(undefined8 *)(lVar5 + 0x28);
          local_60 = *(undefined8 *)(lVar5 + 0x30);
          lVar5 = iDynTree::VectorDynSize::data();
          iDynTree::VectorDynSize::size();
          pvVar11 = (void *)(lVar3 * 8 + lVar5);
          if ((((ulong)pvVar11 & 7) != 0) ||
             (uVar10 = (ulong)((uint)((ulong)pvVar11 >> 3) & 1), (long)uVar9 <= (long)uVar10)) {
            uVar10 = uVar9;
          }
          if (0 < (long)uVar10) {
            memcpy(pvVar11,local_88,uVar10 * 8);
          }
          lVar6 = uVar9 - uVar10;
          lVar12 = (lVar6 - (lVar6 >> 0x3f) & 0xfffffffffffffffeU) + uVar10;
          if (1 < lVar6) {
            lVar7 = uVar10 + 2;
            if ((long)(uVar10 + 2) < lVar12) {
              lVar7 = lVar12;
            }
            memcpy((void *)((lVar3 + uVar10) * 8 + lVar5),local_88 + uVar10,
                   (~uVar10 + lVar7 & 0xfffffffffffffffe) * 8 + 0x10);
          }
          if (lVar12 < (long)uVar9) {
            memcpy((void *)(lVar3 * 8 + lVar5 + (lVar6 / 2) * 0x10 + uVar10 * 8),
                   local_88 + (lVar6 / 2) * 2 + uVar10,(uVar9 - lVar12) * 8);
          }
          if ((this->m_options).includeAllNetExternalWrenchesAsDynamicVariables == true) {
            IVar13 = getRangeLinkVariable(this,NET_EXT_WRENCH,lVar2);
            uVar9 = IVar13.size;
            lVar3 = IVar13.offset;
            lVar5 = iDynTree::LinkWrenches::operator()(local_50,lVar2);
            local_88[0] = *(undefined8 *)(lVar5 + 8);
            local_88[1] = *(undefined8 *)(lVar5 + 0x10);
            local_88[2] = *(undefined8 *)(lVar5 + 0x18);
            local_88[3] = *(undefined8 *)(lVar5 + 0x20);
            uStack_68 = *(undefined8 *)(lVar5 + 0x28);
            local_60 = *(undefined8 *)(lVar5 + 0x30);
            lVar5 = iDynTree::VectorDynSize::data();
            iDynTree::VectorDynSize::size();
            pvVar11 = (void *)(lVar3 * 8 + lVar5);
            if ((((ulong)pvVar11 & 7) != 0) ||
               (uVar10 = (ulong)((uint)((ulong)pvVar11 >> 3) & 1), (long)uVar9 <= (long)uVar10)) {
              uVar10 = uVar9;
            }
            if (0 < (long)uVar10) {
              memcpy(pvVar11,local_88,uVar10 * 8);
            }
            lVar6 = uVar9 - uVar10;
            lVar12 = (lVar6 - (lVar6 >> 0x3f) & 0xfffffffffffffffeU) + uVar10;
            if (1 < lVar6) {
              lVar7 = uVar10 + 2;
              if ((long)(uVar10 + 2) < lVar12) {
                lVar7 = lVar12;
              }
              memcpy((void *)((lVar3 + uVar10) * 8 + lVar5),local_88 + uVar10,
                     (~uVar10 + lVar7 & 0xfffffffffffffffe) * 8 + 0x10);
            }
            if (lVar12 < (long)uVar9) {
              memcpy((void *)(lVar3 * 8 + lVar5 + (lVar6 / 2) * 0x10 + uVar10 * 8),
                     local_88 + (lVar6 / 2) * 2 + uVar10,(uVar9 - lVar12) * 8);
            }
          }
        }
        lVar2 = lVar2 + 1;
        lVar3 = iDynTree::Model::getNrOfLinks();
      } while (lVar2 < lVar3);
    }
    lVar2 = iDynTree::Model::getNrOfJoints();
    if (0 < lVar2) {
      local_58 = (LinkNetTotalWrenchesWithoutGravity *)&this->m_dynamicsTraversal;
      lVar2 = 0;
      do {
        plVar8 = (long *)iDynTree::Model::getJoint((long)this);
        lVar3 = iDynTree::Traversal::getChildLinkIndexFromJointIndex((Model *)local_58,(long)this);
        IVar13 = getRangeJointVariable(this,JOINT_WRENCH,lVar2);
        uVar10 = IVar13.size;
        lVar5 = IVar13.offset;
        lVar3 = iDynTree::LinkWrenches::operator()(local_40,lVar3);
        local_88[0] = *(undefined8 *)(lVar3 + 8);
        local_88[1] = *(undefined8 *)(lVar3 + 0x10);
        local_88[2] = *(undefined8 *)(lVar3 + 0x18);
        local_88[3] = *(undefined8 *)(lVar3 + 0x20);
        uStack_68 = *(undefined8 *)(lVar3 + 0x28);
        local_60 = *(undefined8 *)(lVar3 + 0x30);
        lVar3 = iDynTree::VectorDynSize::data();
        iDynTree::VectorDynSize::size();
        pvVar11 = (void *)(lVar3 + lVar5 * 8);
        uVar9 = uVar10;
        if ((((ulong)pvVar11 & 7) == 0) &&
           (uVar9 = (ulong)((uint)((ulong)pvVar11 >> 3) & 1), (long)uVar10 <= (long)uVar9)) {
          uVar9 = uVar10;
        }
        if (0 < (long)uVar9) {
          memcpy(pvVar11,local_88,uVar9 * 8);
        }
        lVar6 = uVar10 - uVar9;
        lVar12 = (lVar6 - (lVar6 >> 0x3f) & 0xfffffffffffffffeU) + uVar9;
        if (1 < lVar6) {
          lVar7 = uVar9 + 2;
          if ((long)(uVar9 + 2) < lVar12) {
            lVar7 = lVar12;
          }
          memcpy((void *)(lVar3 + (lVar5 + uVar9) * 8),local_88 + uVar9,
                 (~uVar9 + lVar7 & 0xfffffffffffffffe) * 8 + 0x10);
        }
        if (lVar12 < (long)uVar10) {
          memcpy((void *)(lVar3 + (lVar6 / 2) * 0x10 + lVar5 * 8 + uVar9 * 8),
                 local_88 + (lVar6 / 2) * 2 + uVar9,(uVar10 - lVar12) * 8);
        }
        IVar13 = getRangeDOFVariable(this,DOF_ACCELERATION,lVar2);
        uVar9 = (**(code **)(*plVar8 + 0xc0))(plVar8);
        puVar4 = (undefined8 *)iDynTree::VectorDynSize::operator()((VectorDynSize *)jointAccs,uVar9)
        ;
        uVar1 = *puVar4;
        puVar4 = (undefined8 *)iDynTree::VectorDynSize::operator()(d,IVar13.offset);
        *puVar4 = uVar1;
        IVar13 = getRangeDOFVariable(this,DOF_TORQUE,lVar2);
        uVar9 = (**(code **)(*plVar8 + 0xc0))(plVar8);
        puVar4 = (undefined8 *)iDynTree::VectorDynSize::operator()((VectorDynSize *)local_38,uVar9);
        uVar1 = *puVar4;
        puVar4 = (undefined8 *)iDynTree::VectorDynSize::operator()(d,IVar13.offset);
        *puVar4 = uVar1;
        lVar2 = lVar2 + 1;
        lVar3 = iDynTree::Model::getNrOfJoints();
      } while (lVar2 < lVar3);
    }
  }
  return true;
}

Assistant:

bool BerdyHelper::serializeDynamicVariablesFixedBase(LinkProperAccArray& properAccs,
                                                                  LinkNetTotalWrenchesWithoutGravity& netTotalWrenchesWithoutGrav,
                                                                  LinkNetExternalWrenches& netExtWrenches,
                                                                  LinkInternalWrenches& linkJointWrenches,
                                                                  JointDOFsDoubleArray& jointTorques,
                                                                  JointDOFsDoubleArray& jointAccs,
                                                                  VectorDynSize& d)
{
    assert(d.size() == this->getNrOfDynamicVariables());
    assert(this->m_options.berdyVariant == ORIGINAL_BERDY_FIXED_BASE);

    if( this->m_options.berdyVariant == ORIGINAL_BERDY_FIXED_BASE )
    {
        // In the original formulation, also the totalNetWrenchesWithoutGravity where part of the variables
        // And the base link is not considered amoing the dynamic variables
        for(LinkIndex linkIdx = 0; linkIdx < static_cast<LinkIndex>(m_model.getNrOfLinks()); linkIdx++)
        {
            // The base variables are not estimated for ORIGINAL_BERDY_FIXED_BASE
            if( linkIdx != this->m_dynamicsTraversal.getBaseLink()->getIndex() )
            {
                setSubVector(d,getRangeLinkVariable(LINK_BODY_PROPER_ACCELERATION,linkIdx),toEigen(properAccs(linkIdx)));
                setSubVector(d,getRangeLinkVariable(NET_INT_AND_EXT_WRENCHES_ON_LINK_WITHOUT_GRAV,linkIdx),toEigen(netTotalWrenchesWithoutGrav(linkIdx)));
                if( m_options.includeAllNetExternalWrenchesAsDynamicVariables )
                {
                    setSubVector(d,getRangeLinkVariable(NET_EXT_WRENCH,linkIdx),toEigen(netExtWrenches(linkIdx)));
                }
            }
        }

        for(JointIndex jntIdx = 0; jntIdx < static_cast<JointIndex>(m_model.getNrOfJoints()); jntIdx++)
        {
            IJointConstPtr jnt = m_model.getJoint(jntIdx);

            LinkIndex childLink = m_dynamicsTraversal.getChildLinkIndexFromJointIndex(m_model,jntIdx);
            setSubVector(d,getRangeJointVariable(JOINT_WRENCH,jntIdx),toEigen(linkJointWrenches(childLink)));

            // For ORIGINAL_BERDY_FIXED_BASE, we know that every joint has 1 dof
            setSubVector(d,getRangeDOFVariable(DOF_ACCELERATION,jntIdx),jointAccs(jnt->getDOFsOffset()));
            setSubVector(d,getRangeDOFVariable(DOF_TORQUE,jntIdx),jointTorques(jnt->getDOFsOffset()));
        }
    }

    return true;
}